

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_reference.c
# Opt level: O0

bool_t prf_instance_reference_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  ushort *in_RDI;
  bfile_t *unaff_retaddr;
  int pos;
  node_data_conflict4 *data;
  uint16_t in_stack_ffffffffffffffce;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar1;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  bool_t bVar2;
  
  iVar1 = 4;
  if (*in_RDI == prf_instance_reference_info.opcode) {
    bf_put_uint16_be((bfile_t *)CONCAT44(4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffce);
    bf_put_uint16_be((bfile_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffce)
    ;
    bf_put_int16_be((bfile_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffce);
    iVar1 = iVar1 + 2;
    bf_put_int16_be((bfile_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffce);
    if (iVar1 + 2 < (int)(uint)in_RDI[1]) {
      bf_write(unaff_retaddr,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (uint)((ulong)in_RDI >> 0x20));
    }
    bVar2 = 1;
  }
  else {
    prf_error(9,"instance reference save method on node of type %d.",(ulong)*in_RDI);
    bVar2 = 0;
  }
  return bVar2;
}

Assistant:

static bool_t
prf_instance_reference_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile)
{
    node_data * data;
    int pos = 4;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_instance_reference_info.opcode ) {
        prf_error( 9, "instance reference save method on node of type %d.",
                   node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    data = (node_data *) node->data;
    assert( data != NULL );
    bf_put_int16_be( bfile, data->spare ); pos += 2;
    bf_put_int16_be( bfile, data->instance_definition_number ); pos += 2;

    if ( pos < node->length ) /* padding */
        pos += bf_write( bfile, node->data + pos - 4, node->length - pos );
    return TRUE;
}